

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderStatus.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::Mode5TransponderStatus::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Mode5TransponderStatus *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Mode 5 Transponder Status:",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tReply:                   ",0x1b)
  ;
  ENUMS::GetEnumAsStringMode5Reply_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((this->m_StatusUnion).m_ui16Status & 0xf),Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tLine Test:               ",0x1b);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tAntenna Selection:       ",0x1b);
  ENUMS::GetEnumAsStringAntennaSelection_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)(*(uint *)&this->m_StatusUnion >> 5 & 3),Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tCrypto Control:          ",0x1b);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tLocation Included:       ",0x1b);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tLocation Error Included: ",0x1b);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tPlatform Type:           ",0x1b);
  ENUMS::GetEnumAsStringPlatformType_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)(*(uint *)&this->m_StatusUnion >> 10 & 1),Value_01);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tLevel 2 Included:        ",0x1b);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tOn/Off Status:           ",0x1b);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tDamaged:                 ",0x1b);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tMalfunction:             ",0x1b);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString Mode5TransponderStatus::GetAsString() const
{
    KStringStream ss;	

	ss << "Mode 5 Transponder Status:"
	   << "\n\tReply:                   " << GetEnumAsStringMode5Reply( m_StatusUnion.m_ui16Reply )
	   << "\n\tLine Test:               " << ( KBOOL )m_StatusUnion.m_ui16LineTst
	   << "\n\tAntenna Selection:       " << GetEnumAsStringAntennaSelection( m_StatusUnion.m_ui16AntennaSel )
	   << "\n\tCrypto Control:          " << ( KBOOL )m_StatusUnion.m_ui16CryptoCtrl
	   << "\n\tLocation Included:       " << ( KBOOL )m_StatusUnion.m_ui16LatLonAltSrc
	   << "\n\tLocation Error Included: " << ( KBOOL )m_StatusUnion.m_ui16LocErrs
	   << "\n\tPlatform Type:           " << GetEnumAsStringPlatformType( m_StatusUnion.m_ui16PlatfrmTyp )
	   << "\n\tLevel 2 Included:        " << ( KBOOL )m_StatusUnion.m_ui16LvlSel
	   << "\n\tOn/Off Status:           " << ( KBOOL )m_StatusUnion.m_ui16OnOff
	   << "\n\tDamaged:                 " << ( KBOOL )m_StatusUnion.m_ui16Dmg
	   << "\n\tMalfunction:             " << ( KBOOL )m_StatusUnion.m_ui16MalFnc 
	   << "\n";

    return ss.str();
}